

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_logging.cc
# Opt level: O0

bool __thiscall tcmalloc::Logger::AddNum(Logger *this,uint64_t num,int base)

{
  bool bVar1;
  bool local_51;
  char **local_48;
  char *pos;
  char *end;
  char space [22];
  uint64_t uStack_18;
  int base_local;
  uint64_t num_local;
  Logger *this_local;
  
  local_48 = (char **)(space + 0xe);
  uStack_18 = num;
  do {
    local_48 = (char **)((long)local_48 + -1);
    *(char *)local_48 = "0123456789abcdef"[uStack_18 % (ulong)(long)base];
    uStack_18 = uStack_18 / (ulong)(long)base;
    local_51 = uStack_18 != 0 && &end < local_48;
  } while (local_51);
  unique0x100000ac = base;
  bVar1 = AddStr(this,(char *)local_48,(int)(space + 0xe) - (int)local_48);
  return bVar1;
}

Assistant:

bool Logger::AddNum(uint64_t num, int base) {
  static const char kDigits[] = "0123456789abcdef";
  char space[22];  // more than enough for 2^64 in smallest supported base (10)
  char* end = space + sizeof(space);
  char* pos = end;
  do {
    pos--;
    *pos = kDigits[num % base];
    num /= base;
  } while (num > 0 && pos > space);
  return AddStr(pos, end - pos);
}